

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O2

bool draco::DecodeRawSymbols<draco::RAnsSymbolDecoder>
               (uint32_t num_values,DecoderBuffer *src_buffer,uint32_t *out_values)

{
  bool bVar1;
  uint8_t max_bit_length;
  byte local_19;
  
  bVar1 = DecoderBuffer::Decode<unsigned_char>(src_buffer,&local_19);
  if (bVar1) {
    switch(local_19) {
    case 1:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<1>>
                        (num_values,src_buffer,out_values);
      break;
    case 2:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<2>>
                        (num_values,src_buffer,out_values);
      break;
    case 3:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<3>>
                        (num_values,src_buffer,out_values);
      break;
    case 4:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<4>>
                        (num_values,src_buffer,out_values);
      break;
    case 5:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<5>>
                        (num_values,src_buffer,out_values);
      break;
    case 6:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<6>>
                        (num_values,src_buffer,out_values);
      break;
    case 7:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<7>>
                        (num_values,src_buffer,out_values);
      break;
    case 8:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<8>>
                        (num_values,src_buffer,out_values);
      break;
    case 9:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<9>>
                        (num_values,src_buffer,out_values);
      break;
    case 10:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<10>>
                        (num_values,src_buffer,out_values);
      break;
    case 0xb:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<11>>
                        (num_values,src_buffer,out_values);
      break;
    case 0xc:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<12>>
                        (num_values,src_buffer,out_values);
      break;
    case 0xd:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<13>>
                        (num_values,src_buffer,out_values);
      break;
    case 0xe:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<14>>
                        (num_values,src_buffer,out_values);
      break;
    case 0xf:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<15>>
                        (num_values,src_buffer,out_values);
      break;
    case 0x10:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<16>>
                        (num_values,src_buffer,out_values);
      break;
    case 0x11:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<17>>
                        (num_values,src_buffer,out_values);
      break;
    case 0x12:
      bVar1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<18>>
                        (num_values,src_buffer,out_values);
      break;
    default:
      goto switchD_0016b704_default;
    }
  }
  else {
switchD_0016b704_default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DecodeRawSymbols(uint32_t num_values, DecoderBuffer *src_buffer,
                      uint32_t *out_values) {
  uint8_t max_bit_length;
  if (!src_buffer->Decode(&max_bit_length)) {
    return false;
  }
  switch (max_bit_length) {
    case 1:
      return DecodeRawSymbolsInternal<SymbolDecoderT<1>>(num_values, src_buffer,
                                                         out_values);
    case 2:
      return DecodeRawSymbolsInternal<SymbolDecoderT<2>>(num_values, src_buffer,
                                                         out_values);
    case 3:
      return DecodeRawSymbolsInternal<SymbolDecoderT<3>>(num_values, src_buffer,
                                                         out_values);
    case 4:
      return DecodeRawSymbolsInternal<SymbolDecoderT<4>>(num_values, src_buffer,
                                                         out_values);
    case 5:
      return DecodeRawSymbolsInternal<SymbolDecoderT<5>>(num_values, src_buffer,
                                                         out_values);
    case 6:
      return DecodeRawSymbolsInternal<SymbolDecoderT<6>>(num_values, src_buffer,
                                                         out_values);
    case 7:
      return DecodeRawSymbolsInternal<SymbolDecoderT<7>>(num_values, src_buffer,
                                                         out_values);
    case 8:
      return DecodeRawSymbolsInternal<SymbolDecoderT<8>>(num_values, src_buffer,
                                                         out_values);
    case 9:
      return DecodeRawSymbolsInternal<SymbolDecoderT<9>>(num_values, src_buffer,
                                                         out_values);
    case 10:
      return DecodeRawSymbolsInternal<SymbolDecoderT<10>>(
          num_values, src_buffer, out_values);
    case 11:
      return DecodeRawSymbolsInternal<SymbolDecoderT<11>>(
          num_values, src_buffer, out_values);
    case 12:
      return DecodeRawSymbolsInternal<SymbolDecoderT<12>>(
          num_values, src_buffer, out_values);
    case 13:
      return DecodeRawSymbolsInternal<SymbolDecoderT<13>>(
          num_values, src_buffer, out_values);
    case 14:
      return DecodeRawSymbolsInternal<SymbolDecoderT<14>>(
          num_values, src_buffer, out_values);
    case 15:
      return DecodeRawSymbolsInternal<SymbolDecoderT<15>>(
          num_values, src_buffer, out_values);
    case 16:
      return DecodeRawSymbolsInternal<SymbolDecoderT<16>>(
          num_values, src_buffer, out_values);
    case 17:
      return DecodeRawSymbolsInternal<SymbolDecoderT<17>>(
          num_values, src_buffer, out_values);
    case 18:
      return DecodeRawSymbolsInternal<SymbolDecoderT<18>>(
          num_values, src_buffer, out_values);
    default:
      return false;
  }
}